

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O0

void Cmf_CreateOptions_rec(Vec_Wec_t *vPars,int iPar,char (*Argv) [20],int Argc,Vec_Ptr_t *vOpts)

{
  int iVar1;
  uint uVar2;
  satoko_opts_t *Entry;
  char *Entry_00;
  void *pvVar3;
  Vec_Int_t *p;
  float fVar4;
  float NumF;
  char *pArgv [100];
  satoko_opts_t *pOpts;
  int i;
  int Num;
  int Symb;
  Vec_Int_t *vLine;
  Vec_Ptr_t *vOpts_local;
  int Argc_local;
  char (*Argv_local) [20];
  int iPar_local;
  Vec_Wec_t *vPars_local;
  
  if (100 < Argc) {
    __assert_fail("Argc <= CMD_AUTO_ARG_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                  ,0x1cc,
                  "void Cmf_CreateOptions_rec(Vec_Wec_t *, int, char (*)[20], int, Vec_Ptr_t *)");
  }
  iVar1 = Vec_WecSize(vPars);
  if (iVar1 == iPar) {
    for (pOpts._4_4_ = 0; pOpts._4_4_ < Argc; pOpts._4_4_ = pOpts._4_4_ + 1) {
      pArgv[(long)pOpts._4_4_ + -1] = Argv[pOpts._4_4_];
    }
    Entry = Cmd_DeriveOptionFromSettings(Argc,(char **)&stack0xfffffffffffffc88);
    if (Entry == (satoko_opts_t *)0x0) {
      printf("Cannot parse command line options...\n");
    }
    else {
      Vec_PtrPush(vOpts,Entry);
      Entry_00 = Cmd_DeriveConvertIntoString(Argc,(char **)&stack0xfffffffffffffc88);
      Vec_PtrPush(vOpts,Entry_00);
      pvVar3 = Vec_PtrEntryLast(vOpts);
      printf("Adding settings %s\n",pvVar3);
    }
  }
  else {
    p = Vec_WecEntry(vPars,iPar);
    iVar1 = Vec_IntSize(p);
    if (iVar1 == 2) {
      uVar2 = Vec_IntEntry(p,0);
      iVar1 = Vec_IntEntry(p,1);
      fVar4 = Abc_Int2Float(iVar1);
      if ((fVar4 != -1.0) || (NAN(fVar4))) {
        __assert_fail("Abc_Int2Float(Num) == -1.0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                      ,0x1e4,
                      "void Cmf_CreateOptions_rec(Vec_Wec_t *, int, char (*)[20], int, Vec_Ptr_t *)"
                     );
      }
      Cmf_CreateOptions_rec(vPars,iPar + 1,Argv,Argc,vOpts);
      sprintf(Argv[Argc],"-%c",(ulong)uVar2);
      Cmf_CreateOptions_rec(vPars,iPar + 1,Argv,Argc + 1,vOpts);
    }
    else {
      for (pOpts._4_4_ = 0; iVar1 = Vec_IntSize(p), pOpts._4_4_ + 1 < iVar1;
          pOpts._4_4_ = pOpts._4_4_ + 2) {
        uVar2 = Vec_IntEntry(p,pOpts._4_4_);
        iVar1 = Vec_IntEntry(p,pOpts._4_4_ + 1);
        fVar4 = Abc_Int2Float(iVar1);
        if (fVar4 < 0.0) {
          __assert_fail("NumF >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                        ,0x1f1,
                        "void Cmf_CreateOptions_rec(Vec_Wec_t *, int, char (*)[20], int, Vec_Ptr_t *)"
                       );
        }
        sprintf(Argv[Argc],"-%c",(ulong)uVar2);
        if ((fVar4 != (float)(int)fVar4) || (NAN(fVar4) || NAN((float)(int)fVar4))) {
          sprintf(Argv[Argc + 1],"%.3f",(double)fVar4);
        }
        else {
          sprintf(Argv[Argc + 1],"%d",(ulong)(uint)(int)fVar4);
        }
        Cmf_CreateOptions_rec(vPars,iPar + 1,Argv,Argc + 2,vOpts);
      }
    }
  }
  return;
}

Assistant:

void Cmf_CreateOptions_rec( Vec_Wec_t * vPars, int iPar, char Argv[CMD_AUTO_ARG_MAX][20], int Argc, Vec_Ptr_t * vOpts )
{
    Vec_Int_t * vLine;
    int Symb, Num, i;
    assert( Argc <= CMD_AUTO_ARG_MAX );
    if ( Vec_WecSize(vPars) == iPar )
    {
        satoko_opts_t * pOpts;
        char * pArgv[CMD_AUTO_ARG_MAX];
        for ( i = 0; i < Argc; i++ )
            pArgv[i] = Argv[i];
        pOpts = Cmd_DeriveOptionFromSettings( Argc, pArgv );
        if ( pOpts == NULL )
            printf( "Cannot parse command line options...\n" );
        else
        {
            Vec_PtrPush( vOpts, pOpts );
            Vec_PtrPush( vOpts, Cmd_DeriveConvertIntoString(Argc, pArgv) );
            printf( "Adding settings %s\n", (char *)Vec_PtrEntryLast(vOpts) );
        }
        return;
    }
    vLine = Vec_WecEntry( vPars, iPar );
    // consider binary option
    if ( Vec_IntSize(vLine) == 2 )
    {
        Symb = Vec_IntEntry( vLine, 0 );
        Num = Vec_IntEntry( vLine, 1 );
        assert( Abc_Int2Float(Num) == -1.0 );
        // create one setting without this option
        Cmf_CreateOptions_rec( vPars, iPar+1, Argv, Argc, vOpts );
        // create another setting with this option
        sprintf( Argv[Argc], "-%c", Symb );
        Cmf_CreateOptions_rec( vPars, iPar+1, Argv, Argc+1, vOpts );
        return;
    }
    // consider numeric option
    Vec_IntForEachEntryDouble( vLine, Symb, Num, i )
    {
        float NumF = Abc_Int2Float(Num);
        // create setting with this option
        assert( NumF >= 0 );
        sprintf( Argv[Argc], "-%c", Symb );
        if ( NumF == (float)(int)NumF )
            sprintf( Argv[Argc+1], "%d", (int)NumF );
        else
            sprintf( Argv[Argc+1], "%.3f", NumF );
        Cmf_CreateOptions_rec( vPars, iPar+1, Argv, Argc+2, vOpts );
    }
}